

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

string * ORPG::Utils::file_to_string(string *__return_storage_ptr__,string *file)

{
  char cVar1;
  istream *piVar2;
  string buffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  ifstream screen_file;
  
  Core::DATA_LOCATION_abi_cxx11_();
  std::operator+(&local_258,&local_278,"/");
  std::operator+(&buffer,&local_258,file);
  std::ifstream::ifstream(&screen_file,(string *)&buffer,_S_in);
  std::__cxx11::string::~string((string *)&buffer);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"",(allocator<char> *)&buffer);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    Core::DATA_LOCATION_abi_cxx11_();
    printf("file %s/%s could not be opened\n",buffer._M_dataplus._M_p,(file->_M_dataplus)._M_p);
  }
  else {
    buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
    buffer._M_string_length = 0;
    buffer.field_2._M_local_buf[0] = '\0';
    while( true ) {
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&screen_file,(string *)&buffer);
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
      std::operator+(&local_278,__return_storage_ptr__,&buffer);
      std::operator+(&local_258,&local_278,'\n');
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_258);
      std::__cxx11::string::~string((string *)&local_258);
      std::__cxx11::string::~string((string *)&local_278);
    }
    std::ifstream::close();
  }
  std::__cxx11::string::~string((string *)&buffer);
  std::ifstream::~ifstream(&screen_file);
  return __return_storage_ptr__;
}

Assistant:

string file_to_string(string file) {
            // Open the data file for the current screen
            ifstream screen_file(Core::DATA_LOCATION()+"/"+file);
            string ret = "";

            if (screen_file.is_open()) {
                string buffer;

                while (getline(screen_file, buffer)) {
                    ret = ret + buffer + '\n';
                }
                screen_file.close();
            }
            else {
                // TODO: Raise an exception here, if an asset file
                // cannot be opened then something serious has gone wrong.
                printf("file %s/%s could not be opened\n", Core::DATA_LOCATION().c_str(), file.c_str());
            }

            return ret;
        }